

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O1

void * dmrC_allocator_allocate(allocator *A,size_t extra)

{
  undefined8 *__s;
  allocation_blob *paVar1;
  size_t sVar2;
  void *pvVar3;
  allocation_blob *__s_00;
  size_t __n;
  ulong uVar4;
  ulong __size;
  ulong uVar5;
  ulong uVar6;
  
  __n = extra + A->size_;
  __size = (ulong)A->chunking_;
  if (__size < __n) {
    __assert_fail("size <= A->chunking_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/allocate.c"
                  ,0x4d,"void *dmrC_allocator_allocate(struct allocator *, size_t)");
  }
  __s = (undefined8 *)A->freelist_;
  if (__s != (undefined8 *)0x0) {
    A->freelist_ = (void *)*__s;
    pvVar3 = memset(__s,0,__n);
    return pvVar3;
  }
  uVar6 = (ulong)A->alignment_;
  paVar1 = A->blobs_;
  A->allocations = A->allocations + 1;
  A->useful_bytes = A->useful_bytes + __n;
  uVar4 = (__n + uVar6) - 1 & -uVar6;
  if ((paVar1 == (allocation_blob *)0x0) || (__s_00 = paVar1, paVar1->left < uVar4)) {
    uVar5 = __size;
    __s_00 = (allocation_blob *)malloc(__size);
    if (__s_00 == (allocation_blob *)0x0) {
      dmrC_allocator_allocate_cold_1();
      pvVar3 = *(void **)(uVar5 + 0x20);
      *(void **)extra = pvVar3;
      *(size_t *)(uVar5 + 0x20) = extra;
      return pvVar3;
    }
    memset(__s_00,0,__size);
    A->total_bytes = A->total_bytes + __size;
    __s_00->next = paVar1;
    A->blobs_ = __s_00;
    uVar6 = uVar6 + 0x17 & -uVar6;
    __s_00->left = __size - uVar6;
    __s_00->offset = uVar6 - 0x18;
  }
  sVar2 = __s_00->offset;
  __s_00->offset = sVar2 + uVar4;
  __s_00->left = __s_00->left - uVar4;
  return (void *)((long)&__s_00[1].next + sVar2);
}

Assistant:

void *dmrC_allocator_allocate(struct allocator *A, size_t extra) {
  size_t size = extra + A->size_;
  size_t alignment = A->alignment_;
  struct allocation_blob *blob = A->blobs_;
  void *retval;

  assert(size <= A->chunking_);
  /*
  * NOTE! The freelist only works with things that are
  *  (a) sufficiently aligned
  *  (b) use a constant size
  * Don't try to free allocators that don't follow
  * these rules.
  */
  if (A->freelist_) {
    void **p = (void **)A->freelist_;
    retval = p;
    A->freelist_ = *p;
    memset(retval, 0, size);
    return retval;
  }

  A->allocations++;
  A->useful_bytes += size;
  size = (size + alignment - 1) & ~(alignment - 1);
  if (!blob || blob->left < size) {
    size_t offset, chunking = A->chunking_;
    struct allocation_blob *newblob =
        (struct allocation_blob *)dmrC_blob_alloc(chunking);
    if (!newblob) {
      fprintf(stderr, "out of memory\n");
      abort();
    }
    A->total_bytes += chunking;
    newblob->next = blob;
    blob = newblob;
    A->blobs_ = newblob;
    offset = offsetof(struct allocation_blob, data);
    offset = (offset + alignment - 1) & ~(alignment - 1);
    blob->left = chunking - offset;
    blob->offset = offset - offsetof(struct allocation_blob, data);
  }
  retval = blob->data + blob->offset;
  blob->offset += size;
  blob->left -= size;
  return retval;
}